

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O3

array<unsigned_char,_6UL> __thiscall ixy::IxgbeDevice::get_mac_addr(IxgbeDevice *this)

{
  uint uVar1;
  
  if ((0x53ff < this->len - 4) && (uVar1 = *(uint *)(this->addr + 0x5400), 0x5403 < this->len - 4))
  {
    return (_Type)((uint6)(uVar1 & 0xff) |
                  (uint6)(uVar1 & 0xff00) |
                  (uint6)(uVar1 & 0xff0000) |
                  (uint6)(uVar1 & 0xff000000) |
                  (uint6)(*(uint *)(this->addr + 0x5404) & 0xff) << 0x20 |
                  (uint6)(*(uint *)(this->addr + 0x5404) >> 8) << 0x28);
  }
  __assert_fail("reg <= len - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                ,0x1cb,"uint32_t ixy::IxgbeDevice::get_reg32(uint64_t)");
}

Assistant:

auto IxgbeDevice::get_mac_addr() -> std::array<uint8_t, 6> {
    auto low = get_reg32(IXGBE_RAL(0));
    auto high = get_reg32(IXGBE_RAH(0));

    return {
            static_cast<uint8_t>(low),
            static_cast<uint8_t>(low >> 8u),
            static_cast<uint8_t>(low >> 16u),
            static_cast<uint8_t>(low >> 24u),
            static_cast<uint8_t>(high),
            static_cast<uint8_t>(high >> 8u),
    };
}